

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

MIPMap * pbrt::MIPMap::CreateFromFile
                   (string *filename,MIPMapFilterOptions *options,WrapMode wrapMode,
                   ColorEncodingHandle *encoding,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  float *pfVar2;
  bool bVar3;
  Half *pHVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  RGBColorSpace *colorSpace;
  ImageChannelDesc rgbDesc;
  ImageChannelDesc rgbaDesc;
  ImageAndMetadata imageAndMetadata;
  polymorphic_allocator<std::byte> local_2e8;
  float local_2e0;
  WrapMode local_2dc;
  undefined1 local_2d8 [32];
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  *local_2b8 [2];
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_2a8;
  undefined1 local_2a0 [8];
  long *local_298 [2];
  long local_288;
  undefined1 local_280 [8];
  Half *local_278 [2];
  Half local_268 [4];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_260;
  MIPMapFilterOptions *local_240;
  long local_238;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_230;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_200;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_1d0;
  ImageAndMetadata local_1c8;
  bool bVar4;
  
  local_1d0.bits =
       (encoding->
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       ).bits;
  local_2e8.memoryResource = alloc.memoryResource;
  local_2dc = wrapMode;
  Image::Read(&local_1c8,filename,alloc,(ColorEncodingHandle *)&local_1d0);
  if ((int)local_1c8.image.channelNames.nStored == 1) goto LAB_0039474f;
  local_2d8._0_8_ = local_2d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"R","");
  local_2b8[0] = &local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"G","");
  plVar6 = &local_288;
  local_298[0] = plVar6;
  local_240 = options;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"B","");
  pHVar5 = local_268;
  local_278[0] = pHVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"A","");
  requestedChannels.n = 4;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8;
  Image::GetChannelDesc((ImageChannelDesc *)&local_200,&local_1c8.image,requestedChannels);
  lVar7 = -0x80;
  do {
    if (pHVar5 != *(Half **)(pHVar5 + -8)) {
      operator_delete(*(Half **)(pHVar5 + -8),*(long *)pHVar5 + 1);
    }
    pHVar5 = pHVar5 + -0x10;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  local_2d8._0_8_ = local_2d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"R","");
  local_2b8[0] = &local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"G","");
  local_298[0] = plVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"B","");
  requestedChannels_00.n = 3;
  requestedChannels_00.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8;
  Image::GetChannelDesc((ImageChannelDesc *)&local_230,&local_1c8.image,requestedChannels_00);
  lVar7 = -0x60;
  do {
    if (plVar6 != (long *)plVar6[-2]) {
      operator_delete((long *)plVar6[-2],*plVar6 + 1);
    }
    plVar6 = plVar6 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  if (local_200.nStored == 0) {
    if (local_230.nStored == 0) {
      ErrorExit<std::__cxx11::string_const&>
                ("%s: image doesn\'t have R, G, and B channels",filename);
    }
    Image::SelectChannels
              ((Image *)local_2d8,&local_1c8.image,(ImageChannelDesc *)&local_230,
               (Allocator)local_2e8.memoryResource);
    local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = local_2d8._8_4_;
    local_1c8.image.format = local_2d8._0_4_;
    local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = local_2d8._4_4_;
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_1c8.image.channelNames,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d8 + 0x10));
    local_1c8.image.encoding.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )local_2a8.bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&local_1c8.image.p8,
               (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_2a0)
    ;
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&local_1c8.image.p16,
               (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_280);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&local_1c8.image.p32,&local_260);
  }
  else {
    if (0 < local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.y) {
      bVar4 = true;
      bVar3 = true;
      lVar8 = 0;
      lVar7 = 0;
      do {
        local_238 = lVar7;
        if (0 < local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.x) {
          lVar7 = 0;
          bVar3 = bVar4;
          do {
            Image::GetChannels((ImageChannelValues *)local_2d8,&local_1c8.image,
                               (Point2i)(lVar8 + lVar7),(ImageChannelDesc *)&local_200,
                               (WrapMode2D)0x200000002);
            pfVar2 = (float *)(CONCAT44(local_2d8._12_4_,local_2d8._8_4_) + 0xc);
            if (CONCAT44(local_2d8._12_4_,local_2d8._8_4_) == 0) {
              pfVar2 = (float *)(local_2d8 + 0x1c);
            }
            local_2e0 = *pfVar2;
            InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                      ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                       local_2d8);
            if (local_2e0 != 1.0) {
              bVar3 = false;
            }
            if (NAN(local_2e0)) {
              bVar3 = false;
            }
            lVar7 = lVar7 + 1;
            bVar4 = bVar3;
          } while (lVar7 < local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
        }
        lVar7 = local_238 + 1;
        lVar8 = lVar8 + 0x100000000;
      } while (lVar7 < local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
      if (!bVar3) {
        Image::SelectChannels
                  ((Image *)local_2d8,&local_1c8.image,(ImageChannelDesc *)&local_200,
                   (Allocator)local_2e8.memoryResource);
        local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = local_2d8._8_4_;
        local_1c8.image.format = local_2d8._0_4_;
        local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = local_2d8._4_4_;
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&local_1c8.image.channelNames,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_2d8 + 0x10));
        local_1c8.image.encoding.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )local_2a8.bits;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  (&local_1c8.image.p8,
                   (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   local_2a0);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  (&local_1c8.image.p16,
                   (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_280);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&local_1c8.image.p32,&local_260);
        goto LAB_0039470d;
      }
    }
    Image::SelectChannels
              ((Image *)local_2d8,&local_1c8.image,(ImageChannelDesc *)&local_230,
               (Allocator)local_2e8.memoryResource);
    local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = local_2d8._8_4_;
    local_1c8.image.format = local_2d8._0_4_;
    local_1c8.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = local_2d8._4_4_;
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_1c8.image.channelNames,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2d8 + 0x10));
    local_1c8.image.encoding.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )local_2a8.bits;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&local_1c8.image.p8,
               (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_2a0)
    ;
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&local_1c8.image.p16,
               (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_280);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&local_1c8.image.p32,&local_260);
  }
LAB_0039470d:
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_260);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
            ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_280);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)local_2a0);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2d8 + 0x10));
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&local_230);
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&local_200);
  options = local_240;
LAB_0039474f:
  local_2d8._0_8_ = ImageMetadata::GetColorSpace(&local_1c8.metadata);
  iVar1 = (*(local_2e8.memoryResource)->_vptr_memory_resource[2])(local_2e8.memoryResource,0x38,8);
  pstd::pmr::polymorphic_allocator<std::byte>::
  construct<pbrt::MIPMap,pbrt::Image,pbrt::RGBColorSpace_const*&,pbrt::WrapMode&,pstd::pmr::polymorphic_allocator<std::byte>&,pbrt::MIPMapFilterOptions_const&>
            (&local_2e8,(MIPMap *)CONCAT44(extraout_var,iVar1),&local_1c8.image,
             (RGBColorSpace **)local_2d8,&local_2dc,&local_2e8,options);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_1c8.metadata.stringVectors._M_t);
  if (local_1c8.metadata.colorSpace.set == true) {
    local_1c8.metadata.colorSpace.set = false;
  }
  if (local_1c8.metadata.MSE.set == true) {
    local_1c8.metadata.MSE.set = false;
  }
  if (local_1c8.metadata.samplesPerPixel.set == true) {
    local_1c8.metadata.samplesPerPixel.set = false;
  }
  if (local_1c8.metadata.fullResolution.set == true) {
    local_1c8.metadata.fullResolution.set = false;
  }
  if (local_1c8.metadata.pixelBounds.set == true) {
    local_1c8.metadata.pixelBounds.set = false;
  }
  if (local_1c8.metadata.NDCFromWorld.set == true) {
    local_1c8.metadata.NDCFromWorld.set = false;
  }
  if (local_1c8.metadata.cameraFromWorld.set == true) {
    local_1c8.metadata.cameraFromWorld.set = false;
  }
  if (local_1c8.metadata.renderTimeSeconds.set == true) {
    local_1c8.metadata.renderTimeSeconds.set = false;
  }
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_1c8.image.p32);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
            (&local_1c8.image.p16);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            (&local_1c8.image.p8);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8.image.channelNames);
  return (MIPMap *)CONCAT44(extraout_var,iVar1);
}

Assistant:

MIPMap *MIPMap::CreateFromFile(const std::string &filename,
                               const MIPMapFilterOptions &options, WrapMode wrapMode,
                               ColorEncodingHandle encoding, Allocator alloc) {
    ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc, encoding);

    Image &image = imageAndMetadata.image;
    if (image.NChannels() != 1) {
        // Get the channels in a canonical order..
        ImageChannelDesc rgbaDesc = image.GetChannelDesc({"R", "G", "B", "A"});
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (rgbaDesc) {
            // Is alpha all ones?
            bool allOne = true;
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x)
                    if (image.GetChannels({x, y}, rgbaDesc)[3] != 1)
                        allOne = false;
            if (allOne)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                image = image.SelectChannels(rgbaDesc, alloc);
        } else {
            if (rgbDesc)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                ErrorExit("%s: image doesn't have R, G, and B channels", filename);
        }
    }

    const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();
    return alloc.new_object<MIPMap>(std::move(image), colorSpace, wrapMode, alloc,
                                    options);
}